

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  SegmentKind SVar1;
  pointer ppMVar2;
  Memory *args;
  pointer ppGVar3;
  Global *args_00;
  pointer ppTVar4;
  Table *args_01;
  pointer ppDVar5;
  DataSegment *pDVar6;
  pointer ppFVar7;
  Func *f;
  Type t;
  LoadStoreTracking *this_00;
  size_type sVar8;
  bool bVar9;
  Module *pMVar10;
  pointer pTVar11;
  char *args_1;
  string *args_1_00;
  pointer ppFVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  Index extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar14;
  undefined8 extraout_RDX_00;
  Index IVar15;
  char (*args_2) [2];
  char (*in_R9) [4];
  Index i_1;
  pointer ppMVar16;
  pointer ppGVar17;
  pointer ppTVar18;
  pointer ppDVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  Decompiler *this_01;
  Index i;
  uint __val;
  ulong uVar21;
  _Alloc_hider _Var22;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  Decompiler *pDVar23;
  Decompiler *pDVar24;
  allocator<char> local_181;
  LoadStoreTracking *local_180;
  ulong local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string local_138;
  string local_118;
  string ds;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar10 = (this->mc).module;
  ppMVar2 = (pMVar10->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  for (ppMVar16 = (pMVar10->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppMVar16 != ppMVar2; ppMVar16 = ppMVar16 + 1) {
    args = *ppMVar16;
    in_R9 = (char (*) [4])(args->name)._M_dataplus._M_p;
    IVar15 = (Index)pbVar13;
    name_00._M_str = (char *)in_R9;
    name_00._M_len = (args->name)._M_string_length;
    bVar9 = CheckImportExport(this,__return_storage_ptr__,Memory,IVar15,name_00);
    cat<char[8],std::__cxx11::string>(&ds,(wabt *)"memory ",(char (*) [8])args,pbVar13);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    if (!bVar9) {
      std::__cxx11::to_string(&name,(args->page_limits).initial);
      std::__cxx11::to_string(&local_138,(args->page_limits).max);
      in_R9 = (char (*) [4])0x1629bd;
      cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                (&ds,(wabt *)"(initial: ",(char (*) [11])&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                 (char (*) [8])&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1629bd,
                 (char (*) [2])this);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (ulong)(IVar15 + 1);
  }
  pMVar10 = (this->mc).module;
  pDVar23 = this;
  if ((pMVar10->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pMVar10->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar10 = (this->mc).module;
  }
  ppGVar3 = (pMVar10->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  IVar15 = 0;
  for (ppGVar17 = (pMVar10->globals).
                  super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppGVar17 != ppGVar3; ppGVar17 = ppGVar17 + 1) {
    args_00 = *ppGVar17;
    in_R9 = (char (*) [4])(args_00->name)._M_dataplus._M_p;
    name_01._M_str = (char *)in_R9;
    name_01._M_len = (args_00->name)._M_string_length;
    bVar9 = CheckImportExport(pDVar23,__return_storage_ptr__,Global,IVar15,name_01);
    name._M_dataplus._M_p = GetDecompTypeName(args_00->type);
    args_1 = ":";
    cat<char[8],std::__cxx11::string,char[2],char_const*>
              (&ds,(wabt *)"global ",(char (*) [8])args_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
               (char (*) [2])&name,(char **)in_R9);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    if (!bVar9) {
      InitExp_abi_cxx11_(&name,pDVar23,&args_00->init_expr);
      cat<char[4],std::__cxx11::string>
                (&ds,(wabt *)" = ",(char (*) [4])&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    IVar15 = IVar15 + 1;
  }
  pMVar10 = (pDVar23->mc).module;
  pDVar24 = pDVar23;
  if ((pMVar10->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (pMVar10->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar10 = (pDVar23->mc).module;
  }
  ppTVar4 = (pMVar10->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  IVar15 = 0;
  for (ppTVar18 = (pMVar10->tables).
                  super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppTVar18 != ppTVar4; ppTVar18 = ppTVar18 + 1) {
    args_01 = *ppTVar18;
    in_R9 = (char (*) [4])(args_01->name)._M_dataplus._M_p;
    name_02._M_str = (char *)in_R9;
    name_02._M_len = (args_01->name)._M_string_length;
    bVar9 = CheckImportExport(pDVar24,__return_storage_ptr__,Table,IVar15,name_02);
    name._M_dataplus._M_p = GetDecompTypeName(args_01->elem_type);
    cat<char[7],std::__cxx11::string,char[2],char_const*>
              (&ds,(wabt *)"table ",(char (*) [7])args_01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
               (char (*) [2])&name,(char **)in_R9);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    if (!bVar9) {
      std::__cxx11::to_string(&name,(args_01->elem_limits).initial);
      std::__cxx11::to_string(&local_138,(args_01->elem_limits).max);
      in_R9 = (char (*) [4])0x1629bd;
      cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                (&ds,(wabt *)"(min: ",(char (*) [7])&name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                 (char (*) [8])&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1629bd,
                 (char (*) [2])pDVar24);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    IVar15 = IVar15 + 1;
  }
  pMVar10 = (pDVar24->mc).module;
  args_1_00 = (string *)
              (pMVar10->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pDVar23 = pDVar24;
  if (args_1_00 !=
      (string *)
      (pMVar10->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar10 = (pDVar24->mc).module;
  }
  ppDVar5 = (pMVar10->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar19 = (pMVar10->data_segments).
                  super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppDVar19 != ppDVar5;
      ppDVar19 = ppDVar19 + 1) {
    pDVar6 = *ppDVar19;
    SVar1 = pDVar6->kind;
    if (SVar1 == Passive) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&name,"(passive",&local_181);
    }
    else {
      InitExp_abi_cxx11_(&local_138,pDVar23,&pDVar6->offset);
      cat<char[10],std::__cxx11::string>
                (&name,(wabt *)"(offset: ",(char (*) [10])&local_138,args_1_00);
    }
    args_1_00 = &name;
    cat<char[6],std::__cxx11::string,std::__cxx11::string,char[4]>
              (&ds,(wabt *)"data ",(char (*) [6])&pDVar6->name,&name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") =",in_R9);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if (SVar1 != Passive) {
      std::__cxx11::string::_M_dispose();
    }
    BinaryToString_abi_cxx11_(&ds,pDVar23,&pDVar6->data);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
  }
  pMVar10 = (pDVar23->mc).module;
  pDVar24 = pDVar23;
  if ((pMVar10->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar10->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pMVar10 = (pDVar23->mc).module;
  }
  ppFVar7 = (pMVar10->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_180 = &pDVar23->lst;
  uVar21 = 0;
  this_01 = pDVar23;
  for (ppFVar12 = (pMVar10->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppFVar12 != ppFVar7;
      ppFVar12 = ppFVar12 + 1) {
    f = *ppFVar12;
    this_01->cur_func = f;
    args_2 = (char (*) [2])(f->name)._M_string_length;
    name_03._M_str = (f->name)._M_dataplus._M_p;
    name_03._M_len = (size_t)args_2;
    local_178 = uVar21;
    bVar9 = CheckImportExport(this_01,__return_storage_ptr__,First,(Index)uVar21,name_03);
    AST::AST((AST *)&ds,&this_01->mc,f);
    this_01->cur_ast = (AST *)&ds;
    this_01 = pDVar24;
    if (!bVar9) {
      args_2 = (char (*) [2])0x1;
      AST::Construct((AST *)&ds,&f->exprs,
                     (Index)((ulong)((long)(f->decl).sig.result_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(f->decl).sig.result_types.
                                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3),0,true);
      this_00 = local_180;
      LoadStoreTracking::Track(local_180,(Node *)ds._M_string_length);
      LoadStoreTracking::CheckLayouts(this_00);
      this_01 = pDVar24;
    }
    cat<char[10],std::__cxx11::string,char[2]>
              (&name,(wabt *)"function ",(char (*) [10])f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x158be6,args_2)
    ;
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    uVar21 = 0;
    uVar14 = extraout_RDX;
    while( true ) {
      IVar15 = (Index)uVar14;
      pTVar11 = (f->decl).sig.param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((ulong)((long)(f->decl).sig.param_types.
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pTVar11) >> 3 & 0xffffffff) <=
          uVar21) break;
      if (uVar21 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        pTVar11 = (f->decl).sig.param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start;
        IVar15 = extraout_EDX;
      }
      t = pTVar11[uVar21];
      IndexToAlphaName_abi_cxx11_(&local_118,(wabt *)(uVar21 & 0xffffffff),IVar15);
      std::operator+(&name,"$",&local_118);
      std::__cxx11::string::_M_dispose();
      LocalDecl(&local_118,this_01,&name,t);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      uVar21 = uVar21 + 1;
      uVar14 = extraout_RDX_00;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pTVar11 = (f->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((ulong)((long)(f->decl).sig.result_types.
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pTVar11) >> 3);
    __val = (uint)local_178;
    pDVar24 = this_01;
    if ((int)pbVar13 != 0) {
      if ((int)pbVar13 == 1) {
        local_118._M_dataplus._M_p = GetDecompTypeName(*pTVar11);
        cat<char[2],char_const*>(&name,(wabt *)":",(char (*) [2])&local_118,(char **)pbVar13);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::_M_dispose();
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        while( true ) {
          pTVar11 = (f->decl).sig.result_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((ulong)((long)(f->decl).sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar11) >> 3 &
                    0xffffffff);
          if (pbVar13 <= pbVar20) break;
          if (pbVar20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            pTVar11 = (f->decl).sig.result_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          GetDecompTypeName(pTVar11[(long)pbVar20]);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pbVar20->_M_dataplus)._M_p + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        pDVar24 = this_01;
      }
    }
    if (bVar9) {
      std::__cxx11::to_string(&local_118,__val);
      cat<char[10],std::__cxx11::string>
                (&name,(wabt *)"; // func",(char (*) [10])&local_118,pbVar13);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    else {
      std::__cxx11::to_string(&local_118,__val);
      cat<char[11],std::__cxx11::string,char[2]>
                (&name,(wabt *)" { // func",(char (*) [11])&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x158119,
                 args_2);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      DecompileExpr((Value *)&name,this_01,(Node *)ds._M_string_length,(Node *)0x0);
      IndentValue(this_01,(Value *)&name,this_01->indent_amount,(string_view)ZEXT816(0));
      sVar8 = name._M_string_length;
      this_01 = pDVar24;
      for (_Var22 = name._M_dataplus; _Var22._M_p != (pointer)sVar8;
          _Var22._M_p = _Var22._M_p + 0x20) {
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name);
      __val = (uint)local_178;
      pDVar24 = this_01;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    ModuleContext::EndFunc(&this_01->mc);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
             *)local_180);
    uVar21 = (ulong)(__val + 1);
    pDVar23->cur_func = (Func *)0x0;
    pDVar23->cur_ast = (AST *)0x0;
    AST::~AST((AST *)&ds);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name,
               dat->kind != SegmentKind::Passive
                   ? cat("(offset: ", InitExp(dat->offset))
                   : "(passive",
               ") =");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      } else {
        s += " ";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), 0, true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += cat("; // func", std::to_string(func_index));
      } else {
        s += cat(" { // func", std::to_string(func_index), "\n");
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }